

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

bool __thiscall
MT32Emu::MidiEventQueue::pushSysex
          (MidiEventQueue *this,Bit8u *sysexData,Bit32u sysexLength,Bit32u timestamp)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  MidiEvent *pMVar3;
  uint uVar4;
  Bit8u *__dest;
  
  uVar4 = this->endPosition + 1 & this->ringBufferMask;
  if (this->startPosition != uVar4) {
    pMVar3 = this->ringBuffer;
    uVar1 = this->endPosition;
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,pMVar3[uVar1].sysexData,
               (ulong)pMVar3[uVar1].field_1.sysexLength);
    iVar2 = (*this->sysexDataStorage->_vptr_SysexDataStorage[2])
                      (this->sysexDataStorage,(ulong)sysexLength);
    __dest = (Bit8u *)CONCAT44(extraout_var,iVar2);
    if (__dest != (Bit8u *)0x0) {
      pMVar3 = pMVar3 + uVar1;
      memcpy(__dest,sysexData,(ulong)sysexLength);
      pMVar3->sysexData = __dest;
      (pMVar3->field_1).sysexLength = sysexLength;
      pMVar3->timestamp = timestamp;
      this->endPosition = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool MidiEventQueue::pushSysex(const Bit8u *sysexData, Bit32u sysexLength, Bit32u timestamp) {
	Bit32u newEndPosition = (endPosition + 1) & ringBufferMask;
	// If ring buffer is full, bail out.
	if (startPosition == newEndPosition) return false;
	volatile MidiEvent &newEvent = ringBuffer[endPosition];
	sysexDataStorage.dispose(newEvent.sysexData, newEvent.sysexLength);
	Bit8u *dstSysexData = sysexDataStorage.allocate(sysexLength);
	if (dstSysexData == NULL) return false;
	memcpy(dstSysexData, sysexData, sysexLength);
	newEvent.sysexData = dstSysexData;
	newEvent.sysexLength = sysexLength;
	newEvent.timestamp = timestamp;
	endPosition = newEndPosition;
	return true;
}